

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void mouse_handling::onMouseButton(GLFWwindow *window,int button,int action,int mods)

{
  ImGuiIO *pIVar1;
  undefined1 *puVar2;
  
  pIVar1 = ImGui::GetIO();
  if (pIVar1->WantCaptureMouse == false) {
    if (button == 0) {
      puVar2 = &pressed;
    }
    else {
      if (button != 2) {
        return;
      }
      puVar2 = &middlePressed;
    }
    *puVar2 = action == 1;
  }
  return;
}

Assistant:

void onMouseButton(GLFWwindow* window, int button, int action, int mods)
    {
        if(ImGui::GetIO().WantCaptureMouse)
            return; // the mouse is captured by imgui
        if(button == GLFW_MOUSE_BUTTON_LEFT)
            pressed = action == GLFW_PRESS;
        if(button == GLFW_MOUSE_BUTTON_MIDDLE)
            middlePressed = action == GLFW_PRESS;
    }